

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerGeneratorHelper::LowerGeneratorResumeJumpTable
          (LowerGeneratorHelper *this,Instr *jumpTableInstr)

{
  YieldOffsetResumeLabelList *pYVar1;
  LabelInstr *pLVar2;
  Lowerer *this_00;
  Instr *instr;
  code *pcVar3;
  bool bVar4;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  Opnd *compareSrc1;
  uint *puVar7;
  Lowerer *this_02;
  LabelInstr **ppLVar8;
  BailOutInfo *bailOutInfo;
  IntConstOpnd *compareSrc2;
  LabelInstr *target;
  long lVar9;
  long lVar10;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *this_03;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x724c,"(this->func->GetJITFunctionBody()->IsCoroutine())",
                       "this->func->GetJITFunctionBody()->IsCoroutine()");
    if (!bVar4) goto LAB_005c77cd;
    *puVar5 = 0;
  }
  if (jumpTableInstr->m_opcode != GeneratorResumeJumpTable) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x724d,"(jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable)",
                       "jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable");
    if (!bVar4) {
LAB_005c77cd:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pLVar6 = InsertBailOutForElidedYield(this);
  compareSrc1 = IR::Instr::UnlinkSrc1(jumpTableInstr);
  pYVar1 = this->func->m_yieldOffsetResumeLabelList;
  if (0 < (pYVar1->
          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
          ).count) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar10 = 0;
    lVar9 = 0;
    do {
      this_03 = (Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                ((long)&((pYVar1->
                         super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                         ).buffer)->first + lVar10);
      puVar7 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::First(this_03);
      this_02 = (Lowerer *)(ulong)*puVar7;
      ppLVar8 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second(this_03);
      pLVar2 = *ppLVar8;
      target = pLVar6;
      if (pLVar2 != (LabelInstr *)0x0) {
        if ((pLVar2->super_Instr).m_opcode != GeneratorBailInLabel) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x725a,"(resumeLabel->IsGeneratorBailInInstr())",
                             "resumeLabel->IsGeneratorBailInInstr()");
          if (!bVar4) goto LAB_005c77cd;
          *puVar5 = 0;
        }
        this_00 = this->lowerer;
        bailOutInfo = IR::Instr::GetBailOutInfo((pLVar2->super_Instr).m_prev);
        instr = (pLVar2->super_Instr).m_prev;
        EnsureEpilogueLabels(this);
        GenerateJumpToEpilogForBailOut(this_00,bailOutInfo,instr,this->epilogueForBailOut);
        target = pLVar2;
      }
      compareSrc2 = IR::IntConstOpnd::New((IntConstType)this_02,TyUint32,this->func,false);
      InsertCompareBranch(this_02,compareSrc1,&compareSrc2->super_Opnd,BrSrEq_A,false,target,
                          jumpTableInstr,false);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar9 < (pYVar1->
                     super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).count);
  }
  IR::Instr::Remove(jumpTableInstr);
  return;
}

Assistant:

void
Lowerer::LowerGeneratorHelper::LowerGeneratorResumeJumpTable(IR::Instr* jumpTableInstr)
{
    Assert(this->func->GetJITFunctionBody()->IsCoroutine());
    Assert(jumpTableInstr->m_opcode == Js::OpCode::GeneratorResumeJumpTable);

    IR::LabelInstr* bailOutForElidedYield = this->InsertBailOutForElidedYield();

    IR::Opnd* srcOpnd = jumpTableInstr->UnlinkSrc1();

    this->func->MapYieldOffsetResumeLabels([this, &srcOpnd, &jumpTableInstr, &bailOutForElidedYield](int i, const YieldOffsetResumeLabel& yorl)
    {
        uint32 offset = yorl.First();
        IR::LabelInstr* resumeLabel = yorl.Second();

        if (resumeLabel != nullptr)
        {
            Assert(resumeLabel->IsGeneratorBailInInstr());
            // Also fix up the bailout at the label with the jump to epilog that was not emitted in GenerateBailOut()
            this->lowerer->GenerateJumpToEpilogForBailOut(resumeLabel->m_prev->GetBailOutInfo(), resumeLabel->m_prev, this->GetEpilogueForBailOut());
        }
        else if (resumeLabel == nullptr)
        {
            resumeLabel = bailOutForElidedYield;
        }

        // For each offset label pair, insert a compare of the offset and branch if equal to the label
        this->lowerer->InsertCompareBranch(srcOpnd, IR::IntConstOpnd::New(offset, TyUint32, this->func), Js::OpCode::BrSrEq_A, resumeLabel, jumpTableInstr);
    });

    jumpTableInstr->Remove();
}